

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

bool __thiscall Omega_h::CmdLine::parse(CmdLine *this,int *p_argc,char **argv,bool should_print)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  pointer pCVar4;
  string *psVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  pointer pCVar9;
  ulong local_98;
  size_t i_1;
  allocator local_79;
  string local_78 [32];
  reference local_58;
  unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_> *flag;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
  *__range2;
  int local_30;
  bool parsed_by_flag;
  int i;
  bool should_print_local;
  char **argv_local;
  int *p_argc_local;
  CmdLine *this_local;
  
  local_30 = 1;
  do {
    if (*p_argc <= local_30) {
      uVar1 = this->nargs_parsed_;
      sVar7 = std::
              vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
              ::size(&this->args_);
      if (uVar1 < sVar7) {
        if (should_print) {
          for (local_98 = this->nargs_parsed_;
              sVar7 = std::
                      vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                      ::size(&this->args_), local_98 < sVar7; local_98 = local_98 + 1) {
            poVar6 = std::operator<<((ostream *)&std::cout,"missing required argument <");
            pvVar8 = std::
                     vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                     ::operator[](&this->args_,local_98);
            pCVar9 = std::
                     unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::
                     operator->(pvVar8);
            psVar5 = CmdLineItem::name_abi_cxx11_(pCVar9);
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            std::operator<<(poVar6,">\n");
          }
        }
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    bVar3 = false;
    __end2 = std::
             vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
             ::begin(&this->flags_);
    flag = (unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_> *)
           std::
           vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
           ::end(&this->flags_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>_>
                                       *)&flag), bVar2) {
      local_58 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>_>
                 ::operator*(&__end2);
      pCVar4 = std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>::
               operator->(local_58);
      psVar5 = CmdLineItem::name_abi_cxx11_(&pCVar4->super_CmdLineItem);
      bVar2 = std::operator==(psVar5,argv[local_30]);
      if (bVar2) {
        pCVar4 = std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>::
                 operator->(local_58);
        bVar3 = CmdLineItem::parse(&pCVar4->super_CmdLineItem,p_argc,argv,local_30,should_print);
        if (!bVar3) {
          if (should_print) {
            poVar6 = std::operator<<((ostream *)&std::cout,"failed to parse flag ");
            pCVar4 = std::
                     unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>::
                     operator->(local_58);
            psVar5 = CmdLineItem::name_abi_cxx11_(&pCVar4->super_CmdLineItem);
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            std::operator<<(poVar6,'\n');
          }
          return false;
        }
        bVar3 = true;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>_>
      ::operator++(&__end2);
    }
    if (!bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"--help",&local_79);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,argv[local_30]);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      if (bVar3) {
        this->parsed_help_ = true;
        local_30 = local_30 + 1;
      }
      else {
        sVar7 = std::
                vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                ::size(&this->args_);
        if (this->nargs_parsed_ < sVar7) {
          pvVar8 = std::
                   vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                   ::operator[](&this->args_,this->nargs_parsed_);
          pCVar9 = std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                   ::operator->(pvVar8);
          bVar3 = CmdLineItem::parse(pCVar9,p_argc,argv,local_30,should_print);
          if (bVar3) {
            this->nargs_parsed_ = this->nargs_parsed_ + 1;
          }
        }
        else {
          local_30 = local_30 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

bool CmdLine::parse(int* p_argc, char** argv, bool should_print) {
  for (int i = 1; i < *p_argc;) {
    bool parsed_by_flag = false;
    for (auto const& flag : flags_) {
      if (flag->name() == argv[i]) {
        if (!flag->parse(p_argc, argv, i, should_print)) {
          if (should_print) {
            std::cout << "failed to parse flag " << flag->name() << '\n';
          }
          return false;
        }
        parsed_by_flag = true;
      }
    }
    if (parsed_by_flag) {
      continue;
    } else if (std::string("--help") == argv[i]) {
      parsed_help_ = true;
      ++i;
    } else if (args_.size() > nargs_parsed_) {
      if (args_[nargs_parsed_]->parse(p_argc, argv, i, should_print)) {
        ++nargs_parsed_;
      }
    } else {
      ++i;
    }
  }
  if (nargs_parsed_ < args_.size()) {
    if (should_print) {
      for (std::size_t i = nargs_parsed_; i < args_.size(); ++i) {
        std::cout << "missing required argument <" << args_[i]->name() << ">\n";
      }
    }
    return false;
  }
  return true;
}